

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::MILSpec::ListValue::ListValue
          (ListValue *this,Arena *arena,bool is_message_owned)

{
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite,arena,is_message_owned);
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__ListValue_003fa948;
  (this->values_).super_RepeatedPtrFieldBase.arena_ = arena;
  (this->values_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->values_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->values_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  return;
}

Assistant:

ListValue::ListValue(::PROTOBUF_NAMESPACE_ID::Arena* arena,
                         bool is_message_owned)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite(arena, is_message_owned),
  values_(arena) {
  SharedCtor();
  if (!is_message_owned) {
    RegisterArenaDtor(arena);
  }
  // @@protoc_insertion_point(arena_constructor:CoreML.Specification.MILSpec.ListValue)
}